

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtMiniSDF.cpp
# Opt level: O2

bool __thiscall
cbtMiniSDF::interpolate
          (cbtMiniSDF *this,uint field_id,double *dist,cbtVector3 *x,cbtVector3 *gradient)

{
  double dVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint uVar6;
  uint uVar7;
  cbtCell32 *pcVar8;
  double *pdVar9;
  bool bVar10;
  uint uVar11;
  uint uVar12;
  cbtScalar *pcVar13;
  uint uVar14;
  long lVar15;
  uint uVar16;
  uint j;
  ulong uVar17;
  undefined1 auVar18 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined8 in_XMM7_Qb;
  cbtVector3 cVar35;
  cbtVector3 xi;
  cbtVector3 c0;
  cbtAlignedBox3d sd;
  cbtShapeGradients dN;
  cbtShapeMatrix N;
  float local_3a8;
  float fStack_3a4;
  cbtVector3 local_398;
  undefined1 local_388 [16];
  undefined1 local_378 [8];
  float fStack_370;
  float fStack_36c;
  cbtVector3 local_360;
  cbtAlignedBox3d local_350;
  cbtShapeGradients local_330;
  cbtShapeMatrix local_130;
  undefined1 auVar22 [56];
  undefined1 auVar27 [56];
  
  auVar27 = in_ZMM1._8_56_;
  auVar22 = in_ZMM0._8_56_;
  if (this->m_isValid != true) {
    return false;
  }
  bVar10 = cbtAlignedBox3d::contains(&this->m_domain,x);
  if (bVar10) {
    cVar35 = ::operator-(x,(cbtVector3 *)this);
    auVar25._0_8_ = cVar35.m_floats._8_8_;
    auVar25._8_56_ = auVar27;
    auVar19._0_8_ = cVar35.m_floats._0_8_;
    auVar19._8_56_ = auVar22;
    local_330.m_vec[0].m_floats = (cbtScalar  [4])vmovlhps_avx(auVar19._0_16_,auVar25._0_16_);
    auVar22 = ZEXT856(local_330.m_vec[0].m_floats._8_8_);
    cVar35 = ::operator*(local_330.m_vec,&this->m_inv_cell_size);
    auVar26._0_8_ = cVar35.m_floats._8_8_;
    auVar26._8_56_ = auVar27;
    auVar20._0_8_ = cVar35.m_floats._0_8_;
    auVar20._8_56_ = auVar22;
    uVar11 = vcvttss2usi_avx512f(auVar20._0_16_);
    uVar6 = this->m_resolution[0];
    auVar18 = vmovshdup_avx(auVar20._0_16_);
    uVar7 = this->m_resolution[1];
    uVar16 = vcvttss2usi_avx512f(auVar26._0_16_);
    uVar12 = vcvttss2usi_avx512f(auVar18);
    uVar14 = uVar6 - 1;
    if (uVar11 < uVar6) {
      uVar14 = uVar11;
    }
    uVar11 = uVar7 - 1;
    if (uVar12 < uVar7) {
      uVar11 = uVar12;
    }
    uVar12 = this->m_resolution[2] - 1;
    if (uVar16 < this->m_resolution[2]) {
      uVar12 = uVar16;
    }
    uVar14 = (uVar12 * uVar7 + uVar11) * uVar6 + uVar14;
    lVar15 = (long)(int)(this->m_cell_map).m_data[(int)field_id].m_data[(int)uVar14];
    if (lVar15 != -1) {
      subdomain(&local_350,this,uVar14);
      register0x000012c8 = 0;
      local_378._0_4_ = local_350.m_max.m_floats[0];
      local_378._4_4_ = local_350.m_max.m_floats[1];
      auVar31._8_8_ = 0;
      auVar31._0_4_ = local_350.m_min.m_floats[0];
      auVar31._4_4_ = local_350.m_min.m_floats[1];
      local_388 = vsubps_avx(_local_378,auVar31);
      auVar29._8_4_ = 0x40000000;
      auVar29._0_8_ = 0x4000000040000000;
      auVar29._12_4_ = 0x40000000;
      auVar22 = ZEXT856(0);
      auVar18 = vdivps_avx(auVar29,local_388);
      auVar32._0_4_ = 2.0 / (local_350.m_max.m_floats[2] - local_350.m_min.m_floats[2]);
      auVar32._4_12_ = SUB6012((undefined1  [60])0x0,0);
      local_360.m_floats = (cbtScalar  [4])vinsertps_avx(auVar18,auVar32,0x28);
      cVar35 = ::operator*(&local_360,x);
      auVar21._0_8_ = cVar35.m_floats._0_8_;
      auVar21._8_56_ = auVar22;
      local_3a8 = local_350.m_min.m_floats[0];
      fStack_3a4 = local_350.m_min.m_floats[1];
      auVar18._0_4_ = (float)local_378._0_4_ + local_3a8;
      auVar18._4_4_ = (float)local_378._4_4_ + fStack_3a4;
      auVar18._8_4_ = fStack_370 + 0.0;
      auVar18._12_4_ = fStack_36c + 0.0;
      auVar18 = vdivps_avx(auVar18,local_388);
      auVar18 = vsubps_avx(auVar21._0_16_,auVar18);
      local_398.m_floats =
           (cbtScalar  [4])
           vinsertps_avx(auVar18,ZEXT416((uint)(cVar35.m_floats[2] -
                                               (local_350.m_max.m_floats[2] +
                                               local_350.m_min.m_floats[2]) /
                                               (local_350.m_max.m_floats[2] -
                                               local_350.m_min.m_floats[2]))),0x28);
      pcVar8 = (this->m_cells).m_data[(int)field_id].m_data;
      if (gradient == (cbtVector3 *)0x0) {
        shape_function_((cbtShapeMatrix *)&local_330,(cbtMiniSDF *)x,&local_398,
                        (cbtShapeGradients *)0x0);
        auVar18 = ZEXT816(0) << 0x40;
        for (uVar17 = 0; uVar17 != 0x20; uVar17 = uVar17 + 1) {
          dVar1 = (this->m_nodes).m_data[(int)field_id].m_data[(int)pcVar8[lVar15].m_cells[uVar17]];
          auVar28._8_8_ = 0;
          auVar28._0_8_ = dVar1;
          if ((dVar1 == 1.79769313486232e+308) && (!NAN(dVar1))) goto LAB_00e06946;
          auVar5._8_8_ = 0;
          auVar5._0_8_ = *(ulong *)(local_330.m_vec[0].m_floats + uVar17 * 2);
          auVar18 = vfmadd231sd_fma(auVar18,auVar28,auVar5);
        }
        *dist = auVar18._0_8_;
      }
      else {
        shape_function_(&local_130,(cbtMiniSDF *)x,&local_398,&local_330);
        auVar18 = ZEXT816(0) << 0x40;
        auVar29 = ZEXT816(0) << 0x40;
        auVar24 = ZEXT816(0) << 0x40;
        pcVar13 = local_330.m_vec[0].m_floats + 2;
        uVar17 = 0;
        *(undefined1 (*) [16])gradient->m_floats = auVar18;
        pdVar9 = (this->m_nodes).m_data[(int)field_id].m_data;
        while (uVar17 != 0x20) {
          dVar1 = pdVar9[(int)pcVar8[lVar15].m_cells[uVar17]];
          auVar30._8_8_ = 0;
          auVar30._0_8_ = dVar1;
          if ((dVar1 == 1.79769313486232e+308) && (!NAN(dVar1))) {
            gradient->m_floats[0] = 0.0;
            gradient->m_floats[1] = 0.0;
            gradient->m_floats[2] = 0.0;
            gradient->m_floats[3] = 0.0;
            goto LAB_00e06946;
          }
          auVar3._8_8_ = 0;
          auVar3._0_8_ = *(ulong *)((cbtVector3 *)(pcVar13 + -2))->m_floats;
          auVar31 = vcvtps2pd_avx(auVar3);
          auVar18 = vcvtps2pd_avx(auVar18);
          auVar34._8_8_ = dVar1;
          auVar34._0_8_ = dVar1;
          auVar4._8_8_ = 0;
          auVar4._0_8_ = local_130.m_vec[uVar17];
          auVar29 = vfmadd231sd_fma(auVar29,auVar30,auVar4);
          uVar17 = uVar17 + 1;
          auVar18 = vfmadd213pd_fma(auVar34,auVar31,auVar18);
          auVar18 = vcvtpd2ps_avx(auVar18);
          uVar2 = vmovlps_avx(auVar18);
          *(undefined8 *)gradient->m_floats = uVar2;
          auVar23._0_8_ = (double)auVar24._0_4_;
          auVar23._8_8_ = auVar24._8_8_;
          auVar33._0_8_ = (double)*pcVar13;
          auVar33._8_8_ = in_XMM7_Qb;
          pcVar13 = pcVar13 + 4;
          auVar31 = vfmadd231sd_fma(auVar23,auVar30,auVar33);
          auVar24._0_4_ = (float)auVar31._0_8_;
          auVar24._4_12_ = auVar31._4_12_;
          gradient->m_floats[2] = auVar24._0_4_;
        }
        cbtVector3::operator*=(gradient,&local_360);
        *dist = auVar29._0_8_;
      }
LAB_00e06946:
      return 0x1f < uVar17;
    }
  }
  return false;
}

Assistant:

bool cbtMiniSDF::interpolate(unsigned int field_id, double& dist, cbtVector3 const& x,
							cbtVector3* gradient) const
{
	cbtAssert(m_isValid);
	if (!m_isValid)
		return false;

	if (!m_domain.contains(x))
		return false;

	cbtVector3 tmpmi = ((x - m_domain.min()) * (m_inv_cell_size));  //.cast<unsigned int>().eval();
	unsigned int mi[3] = {(unsigned int)tmpmi[0], (unsigned int)tmpmi[1], (unsigned int)tmpmi[2]};
	if (mi[0] >= m_resolution[0])
		mi[0] = m_resolution[0] - 1;
	if (mi[1] >= m_resolution[1])
		mi[1] = m_resolution[1] - 1;
	if (mi[2] >= m_resolution[2])
		mi[2] = m_resolution[2] - 1;
	cbtMultiIndex mui;
	mui.ijk[0] = mi[0];
	mui.ijk[1] = mi[1];
	mui.ijk[2] = mi[2];
	int i = multiToSingleIndex(mui);
	unsigned int i_ = m_cell_map[field_id][i];
	if (i_ == UINT_MAX)
		return false;

	cbtAlignedBox3d sd = subdomain(i);
	i = i_;
	cbtVector3 d = sd.m_max - sd.m_min;  //.diagonal().eval();

	cbtVector3 denom = (sd.max() - sd.min());
	cbtVector3 c0 = cbtVector3(2.0, 2.0, 2.0) / denom;
	cbtVector3 c1 = (sd.max() + sd.min()) / denom;
	cbtVector3 xi = (c0 * x - c1);

	cbtCell32 const& cell = m_cells[field_id][i];
	if (!gradient)
	{
		//auto phi = m_coefficients[field_id][i].dot(shape_function_(xi, 0));
		double phi = 0.0;
		cbtShapeMatrix N = shape_function_(xi, 0);
		for (unsigned int j = 0u; j < 32u; ++j)
		{
			unsigned int v = cell.m_cells[j];
			double c = m_nodes[field_id][v];
			if (c == DBL_MAX)
			{
				return false;
				;
			}
			phi += c * N[j];
		}

		dist = phi;
		return true;
	}

	cbtShapeGradients dN;
	cbtShapeMatrix N = shape_function_(xi, &dN);

	double phi = 0.0;
	gradient->setZero();
	for (unsigned int j = 0u; j < 32u; ++j)
	{
		unsigned int v = cell.m_cells[j];
		double c = m_nodes[field_id][v];
		if (c == DBL_MAX)
		{
			gradient->setZero();
			return false;
		}
		phi += c * N[j];
		(*gradient)[0] += c * dN(j, 0);
		(*gradient)[1] += c * dN(j, 1);
		(*gradient)[2] += c * dN(j, 2);
	}
	(*gradient) *= c0;
	dist = phi;
	return true;
}